

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

void __thiscall pbrt::Integrator::~Integrator(Integrator *this)

{
  undefined8 *in_RDI;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *unaff_retaddr;
  
  *in_RDI = &PTR__Integrator_03748ad0;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector(unaff_retaddr);
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

Integrator::~Integrator() {}